

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

bool cmsys::SystemTools::SetPermissions(char *file,mode_t mode)

{
  bool bVar1;
  allocator local_31;
  string local_30;
  
  if (file == (char *)0x0) {
    bVar1 = false;
  }
  else {
    std::__cxx11::string::string((string *)&local_30,file,&local_31);
    bVar1 = SetPermissions(&local_30,mode);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return bVar1;
}

Assistant:

bool SystemTools::SetPermissions(const char* file, mode_t mode)
{
  if ( !file )
    {
    return false;
    }
  return SystemTools::SetPermissions(kwsys_stl::string(file), mode);
}